

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::MergeFrom(DescriptorProto *this,DescriptorProto *from)

{
  uint uVar1;
  DescriptorProto *in_RSI;
  DescriptorProto *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff18;
  DescriptorProto *in_stack_ffffffffffffff20;
  DescriptorProto *this_00;
  string *in_stack_ffffffffffffff38;
  MessageOptions *in_stack_ffffffffffffff98;
  
  this_00 = (DescriptorProto *)&in_RSI->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_00)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(((InternalMetadataWithArena *)this_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff20 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff20 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::MergeFrom
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
             in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
             in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::MergeFrom
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
             in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
             in_stack_ffffffffffffff18);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff20,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff18);
  uVar1 = (in_RSI->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((DescriptorProto *)0x5184cd);
      _internal_set_name(in_RDI,in_stack_ffffffffffffff38);
    }
    if ((uVar1 & 2) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff20);
      _internal_options(in_RSI);
      MessageOptions::MergeFrom((MessageOptions *)in_RSI,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void DescriptorProto::MergeFrom(const DescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  field_.MergeFrom(from.field_);
  nested_type_.MergeFrom(from.nested_type_);
  enum_type_.MergeFrom(from.enum_type_);
  extension_range_.MergeFrom(from.extension_range_);
  extension_.MergeFrom(from.extension_);
  oneof_decl_.MergeFrom(from.oneof_decl_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::MessageOptions::MergeFrom(from._internal_options());
    }
  }
}